

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O2

QPDFObjectHandle __thiscall
QPDF::readObjectAtOffset
          (QPDF *this,bool try_recovery,qpdf_offset_t offset,string *description,QPDFObjGen exp_og,
          QPDFObjGen *og,bool skip_cache_if_in_xref)

{
  byte bVar1;
  pointer pcVar2;
  long *plVar3;
  QPDFObjGen og_00;
  bool bVar4;
  int iVar5;
  int iVar6;
  qpdf_offset_t qVar7;
  long lVar8;
  qpdf_offset_t end_after_space;
  size_type sVar9;
  QPDFExc *pQVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  undefined7 in_register_00000031;
  string *description_00;
  QPDFObjectHandle QVar12;
  undefined7 in_stack_00000009;
  char in_stack_00000010;
  QPDFObjGen exp_og_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  QPDFExc e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  Token tobjid;
  string local_120;
  Token tgen;
  Token tobj;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  
  description_00 = (string *)CONCAT71(in_register_00000031,try_recovery);
  exp_og_local = (QPDFObjGen)og;
  setLastObjectDescription((QPDF *)description_00,(string *)exp_og,(QPDFObjGen)og);
  if (description == (string *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&tobjid,"object has offset 0",(allocator<char> *)&tgen);
    damagedPDF(&e,(QPDF *)description_00,-1,(string *)&tobjid);
    warn((QPDF *)description_00,&e);
    QPDFExc::~QPDFExc(&e);
    std::__cxx11::string::~string((string *)&tobjid);
    QVar12 = QPDFObjectHandle::newNull();
    _Var11._M_pi = QVar12.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  else {
    pcVar2 = (description_00->_M_dataplus)._M_p;
    bVar1 = pcVar2[0x100];
    plVar3 = *(long **)(pcVar2 + 0xb0);
    (**(code **)(*plVar3 + 0x28))(plVar3,description,0);
    readToken(&tobjid,(QPDF *)description_00,
              *(InputSource **)((description_00->_M_dataplus)._M_p + 0xb0),0);
    if (tobjid.type != tt_integer) {
      pQVar10 = (QPDFExc *)__cxa_allocate_exception(0x80);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&e,"expected n n obj",(allocator<char> *)&tgen);
      damagedPDF(pQVar10,(QPDF *)description_00,(qpdf_offset_t)description,(string *)&e);
      __cxa_throw(pQVar10,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
    readToken(&tgen,(QPDF *)description_00,
              *(InputSource **)((description_00->_M_dataplus)._M_p + 0xb0),0);
    if (tgen.type != tt_integer) {
      pQVar10 = (QPDFExc *)__cxa_allocate_exception(0x80);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&e,"expected n n obj",(allocator<char> *)&tobj);
      damagedPDF(pQVar10,(QPDF *)description_00,(qpdf_offset_t)description,(string *)&e);
      __cxa_throw(pQVar10,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
    readToken(&tobj,(QPDF *)description_00,
              *(InputSource **)((description_00->_M_dataplus)._M_p + 0xb0),0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"obj",(allocator<char> *)&local_248);
    bVar4 = QPDFTokenizer::Token::isWord(&tobj,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    if (!bVar4) {
      pQVar10 = (QPDFExc *)__cxa_allocate_exception(0x80);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&e,"expected n n obj",(allocator<char> *)&local_248);
      damagedPDF(pQVar10,(QPDF *)description_00,(qpdf_offset_t)description,(string *)&e);
      __cxa_throw(pQVar10,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
    iVar5 = QUtil::string_to_int(tobjid.value._M_dataplus._M_p);
    iVar6 = QUtil::string_to_int(tgen.value._M_dataplus._M_p);
    *(ulong *)CONCAT71(in_stack_00000009,skip_cache_if_in_xref) = CONCAT44(iVar6,iVar5);
    if (iVar5 == 0) {
      pQVar10 = (QPDFExc *)__cxa_allocate_exception(0x80);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&e,"object with ID 0",(allocator<char> *)&local_248);
      damagedPDF(pQVar10,(QPDF *)description_00,(qpdf_offset_t)description,(string *)&e);
      __cxa_throw(pQVar10,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
    if (((int)og != 0) && ((exp_og_local.obj != iVar5 || (exp_og_local.gen != iVar6)))) {
      QPDFObjGen::unparse_abi_cxx11_(&local_120,&exp_og_local,' ');
      std::operator+(&local_1a8,"expected ",&local_120);
      std::operator+(&local_248,&local_1a8," obj");
      damagedPDF(&e,(QPDF *)description_00,(qpdf_offset_t)description,&local_248);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::__cxx11::string::~string((string *)&local_120);
      if (((int)og != 0 & (byte)offset & bVar1) != 0) {
        pQVar10 = (QPDFExc *)__cxa_allocate_exception(0x80);
        QPDFExc::QPDFExc(pQVar10,&e);
        __cxa_throw(pQVar10,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
      }
      warn((QPDF *)description_00,&e);
      QPDFExc::~QPDFExc(&e);
    }
    QPDFTokenizer::Token::~Token(&tobj);
    QPDFTokenizer::Token::~Token(&tgen);
    QPDFTokenizer::Token::~Token(&tobjid);
    readObject(this,description_00,exp_og);
    bVar4 = isUnresolved((QPDF *)description_00,
                         *(QPDFObjGen *)CONCAT71(in_stack_00000009,skip_cache_if_in_xref));
    _Var11._M_pi = extraout_RDX;
    if (bVar4) {
      qVar7 = (**(code **)(**(long **)((description_00->_M_dataplus)._M_p + 0xb0) + 0x20))();
      do {
        plVar3 = *(long **)((description_00->_M_dataplus)._M_p + 0xb0);
        lVar8 = (**(code **)(*plVar3 + 0x38))(plVar3,&tobjid,1);
        if (lVar8 == 0) {
          pQVar10 = (QPDFExc *)__cxa_allocate_exception(0x80);
          qVar7 = (**(code **)(**(long **)((description_00->_M_dataplus)._M_p + 0xb0) + 0x20))();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&e,"EOF after endobj",(allocator<char> *)&tgen);
          damagedPDF(pQVar10,(QPDF *)description_00,qVar7,(string *)&e);
          __cxa_throw(pQVar10,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
        }
        iVar5 = isspace(tobjid.type & 0xff);
      } while (iVar5 != 0);
      plVar3 = *(long **)((description_00->_M_dataplus)._M_p + 0xb0);
      (**(code **)(*plVar3 + 0x28))(plVar3,0xffffffffffffffff,1);
      end_after_space =
           (**(code **)(**(long **)((description_00->_M_dataplus)._M_p + 0xb0) + 0x20))();
      if (in_stack_00000010 != '\0') {
        sVar9 = std::
                map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
                ::count((map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
                         *)((description_00->_M_dataplus)._M_p + 0x138),
                        (key_type *)CONCAT71(in_stack_00000009,skip_cache_if_in_xref));
        _Var11._M_pi = extraout_RDX_00;
        if (sVar9 != 0) goto LAB_001e45cf;
      }
      og_00 = *(QPDFObjGen *)CONCAT71(in_stack_00000009,skip_cache_if_in_xref);
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&e,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)this);
      updateCache((QPDF *)description_00,og_00,(shared_ptr<QPDFObject> *)&e,qVar7,end_after_space,
                  true);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&e.field_0x8);
      _Var11._M_pi = extraout_RDX_01;
    }
  }
LAB_001e45cf:
  QVar12.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Var11._M_pi;
  QVar12.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar12.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDF::readObjectAtOffset(
    bool try_recovery,
    qpdf_offset_t offset,
    std::string const& description,
    QPDFObjGen exp_og,
    QPDFObjGen& og,
    bool skip_cache_if_in_xref)
{
    bool check_og = true;
    if (exp_og.getObj() == 0) {
        // This method uses an expect object ID of 0 to indicate that we don't know or don't care
        // what the actual object ID is at this offset. This is true when we read the xref stream
        // and linearization hint streams. In this case, we don't verify the expect object
        // ID/generation against what was read from the file. There is also no reason to attempt
        // xref recovery if we get a failure in this case since the read attempt was not triggered
        // by an xref lookup.
        check_og = false;
        try_recovery = false;
    }
    setLastObjectDescription(description, exp_og);

    if (!m->attempt_recovery) {
        try_recovery = false;
    }

    // Special case: if offset is 0, just return null.  Some PDF writers, in particular
    // "Mac OS X 10.7.5 Quartz PDFContext", may store deleted objects in the xref table as
    // "0000000000 00000 n", which is not correct, but it won't hurt anything for us to ignore
    // these.
    if (offset == 0) {
        QTC::TC("qpdf", "QPDF bogus 0 offset", 0);
        warn(damagedPDF(-1, "object has offset 0"));
        return QPDFObjectHandle::newNull();
    }

    m->file->seek(offset, SEEK_SET);
    try {
        QPDFTokenizer::Token tobjid = readToken(*m->file);
        bool objidok = tobjid.isInteger();
        QTC::TC("qpdf", "QPDF check objid", objidok ? 1 : 0);
        if (!objidok) {
            QTC::TC("qpdf", "QPDF expected n n obj");
            throw damagedPDF(offset, "expected n n obj");
        }
        QPDFTokenizer::Token tgen = readToken(*m->file);
        bool genok = tgen.isInteger();
        QTC::TC("qpdf", "QPDF check generation", genok ? 1 : 0);
        if (!genok) {
            throw damagedPDF(offset, "expected n n obj");
        }
        QPDFTokenizer::Token tobj = readToken(*m->file);

        bool objok = tobj.isWord("obj");
        QTC::TC("qpdf", "QPDF check obj", objok ? 1 : 0);

        if (!objok) {
            throw damagedPDF(offset, "expected n n obj");
        }
        int objid = QUtil::string_to_int(tobjid.getValue().c_str());
        int generation = QUtil::string_to_int(tgen.getValue().c_str());
        og = QPDFObjGen(objid, generation);
        if (objid == 0) {
            QTC::TC("qpdf", "QPDF object id 0");
            throw damagedPDF(offset, "object with ID 0");
        }
        if (check_og && (exp_og != og)) {
            QTC::TC("qpdf", "QPDF err wrong objid/generation");
            QPDFExc e = damagedPDF(offset, "expected " + exp_og.unparse(' ') + " obj");
            if (try_recovery) {
                // Will be retried below
                throw e;
            } else {
                // We can try reading the object anyway even if the ID doesn't match.
                warn(e);
            }
        }
    } catch (QPDFExc& e) {
        if (try_recovery) {
            // Try again after reconstructing xref table
            reconstruct_xref(e);
            if (m->xref_table.count(exp_og) && (m->xref_table[exp_og].getType() == 1)) {
                qpdf_offset_t new_offset = m->xref_table[exp_og].getOffset();
                QPDFObjectHandle result =
                    readObjectAtOffset(false, new_offset, description, exp_og, og, false);
                QTC::TC("qpdf", "QPDF recovered in readObjectAtOffset");
                return result;
            } else {
                QTC::TC("qpdf", "QPDF object gone after xref reconstruction");
                warn(damagedPDF(
                    "",
                    -1,
                    ("object " + exp_og.unparse(' ') +
                     " not found in file after regenerating cross reference "
                     "table")));
                return QPDFObjectHandle::newNull();
            }
        } else {
            throw;
        }
    }

    QPDFObjectHandle oh = readObject(description, og);

    if (isUnresolved(og)) {
        // Store the object in the cache here so it gets cached whether we first know the offset or
        // whether we first know the object ID and generation (in which we case we would get here
        // through resolve).

        // Determine the end offset of this object before and after white space.  We use these
        // numbers to validate linearization hint tables.  Offsets and lengths of objects may imply
        // the end of an object to be anywhere between these values.
        qpdf_offset_t end_before_space = m->file->tell();

        // skip over spaces
        while (true) {
            char ch;
            if (m->file->read(&ch, 1)) {
                if (!isspace(static_cast<unsigned char>(ch))) {
                    m->file->seek(-1, SEEK_CUR);
                    break;
                }
            } else {
                throw damagedPDF(m->file->tell(), "EOF after endobj");
            }
        }
        qpdf_offset_t end_after_space = m->file->tell();
        if (skip_cache_if_in_xref && m->xref_table.count(og)) {
            // Ordinarily, an object gets read here when resolved through xref table or stream. In
            // the special case of the xref stream and linearization hint tables, the offset comes
            // from another source. For the specific case of xref streams, the xref stream is read
            // and loaded into the object cache very early in parsing. Ordinarily, when a file is
            // updated by appending, items inserted into the xref table in later updates take
            // precedence over earlier items. In the special case of reusing the object number
            // previously used as the xref stream, we have the following order of events:
            //
            // * reused object gets loaded into the xref table
            // * old object is read here while reading xref streams
            // * original xref entry is ignored (since already in xref table)
            //
            // It is the second step that causes a problem. Even though the xref table is correct in
            // this case, the old object is already in the cache and so effectively prevails over
            // the reused object. To work around this issue, we have a special case for the xref
            // stream (via the skip_cache_if_in_xref): if the object is already in the xref stream,
            // don't cache what we read here.
            //
            // It is likely that the same bug may exist for linearization hint tables, but the
            // existing code uses end_before_space and end_after_space from the cache, so fixing
            // that would require more significant rework. The chances of a linearization hint
            // stream being reused seems smaller because the xref stream is probably the highest
            // object in the file and the linearization hint stream would be some random place in
            // the middle, so I'm leaving that bug unfixed for now. If the bug were to be fixed, we
            // could use !check_og in place of skip_cache_if_in_xref.
            QTC::TC("qpdf", "QPDF skipping cache for known unchecked object");
        } else {
            updateCache(og, oh.getObj(), end_before_space, end_after_space);
        }
    }

    return oh;
}